

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  pointer plVar3;
  layer_creator_func p_Var4;
  pointer pBVar5;
  iterator __position;
  int *piVar6;
  void *pvVar7;
  Allocator *pAVar8;
  pointer pMVar9;
  long *plVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  Net *pNVar14;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *pvVar15;
  DataReader *pDVar16;
  int iVar17;
  int iVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar19;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  long lVar20;
  long lVar21;
  int *piVar22;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  Mat shape_hints;
  ParamDict pd;
  bool local_a15;
  int local_a14;
  int local_a10;
  int local_a0c;
  Mat local_a08;
  uint local_9c4;
  int local_9c0;
  int local_9bc;
  Layer *local_9b8;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_9b0;
  Net *local_9a8;
  vector<int,_std::allocator<int>_> *local_9a0;
  int local_994;
  vector<int,_std::allocator<int>_> *local_990;
  Mat local_988;
  DataReader *local_940;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_938;
  ParamDict local_930;
  
  local_994 = 0;
  local_9a8 = this;
  iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_994,4);
  if (CONCAT44(extraout_var,iVar17) == 4) {
    if (local_994 == 0x7685dd) {
      local_9bc = 0;
      local_9c0 = 0;
      iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_9bc,4);
      if (CONCAT44(extraout_var_00,iVar17) == 4) {
        iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_9c0,4);
        pNVar14 = local_9a8;
        if (CONCAT44(extraout_var_01,iVar17) == 4) {
          if ((0 < (long)local_9bc) && (0 < local_9c0)) {
            local_938 = &local_9a8->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_938,(long)local_9bc);
            this_00 = &pNVar14->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)local_9c0);
            ParamDict::ParamDict(&local_930);
            local_a0c = 0;
            local_a15 = 0 < local_9bc;
            pvVar15 = this_00;
            pDVar16 = dr;
            if (0 < local_9bc) {
              do {
                local_940 = pDVar16;
                local_9b0 = pvVar15;
                iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_9c4,4);
                if (CONCAT44(extraout_var_02,iVar17) == 4) {
                  iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_a10,4);
                  if (CONCAT44(extraout_var_03,iVar17) != 4) {
                    load_param_bin();
                    goto LAB_0012dffe;
                  }
                  iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_a14,4);
                  if (CONCAT44(extraout_var_04,iVar17) != 4) {
                    load_param_bin();
                    goto LAB_0012dffe;
                  }
                  pLVar19 = create_layer(local_9c4);
                  if (pLVar19 == (Layer *)0x0) {
                    if ((int)local_9c4 < 0) {
LAB_0012ddeb:
                      pLVar19 = (Layer *)0x0;
                    }
                    else {
                      plVar3 = (local_9a8->custom_layer_registry).
                               super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      pLVar19 = (Layer *)0x0;
                      if ((ulong)(local_9c4 & 0xfffffeff) <
                          (ulong)((long)(local_9a8->custom_layer_registry).
                                        super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)plVar3 >>
                                 4)) {
                        p_Var4 = plVar3[local_9c4 & 0xfffffeff].creator;
                        if (p_Var4 == (layer_creator_func)0x0) goto LAB_0012ddeb;
                        pLVar19 = (*p_Var4)();
                      }
                    }
                  }
                  if (pLVar19 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered",(ulong)local_9c4);
                    fputc(10,_stderr);
                    iVar17 = 1;
                    clear(local_9a8);
                  }
                  else {
                    local_990 = &pLVar19->bottoms;
                    std::vector<int,_std::allocator<int>_>::resize(local_990,(long)local_a10);
                    bVar11 = 0 < local_a10;
                    iVar17 = 0x17;
                    local_9b8 = pLVar19;
                    if (0 < local_a10) {
                      lVar20 = 0;
                      do {
                        iVar17 = (*dr->_vptr_DataReader[3])(dr,&local_988,4);
                        if (CONCAT44(extraout_var_05,iVar17) == 4) {
                          pBVar5 = (this_00->
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                   _M_impl.super__Vector_impl_data._M_start;
                          __position._M_current =
                               pBVar5[(int)local_988.data].consumers.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              pBVar5[(int)local_988.data].consumers.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)
                                       &pBVar5[(int)local_988.data].consumers,__position,&local_a0c)
                            ;
                          }
                          else {
                            *__position._M_current = local_a0c;
                            pBVar5[(int)local_988.data].consumers.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish = __position._M_current + 1;
                          }
                          (local_990->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar20] = (int)local_988.data;
                        }
                        else {
                          load_param_bin();
                        }
                        if (CONCAT44(extraout_var_05,iVar17) != 4) {
                          iVar17 = 1;
                          break;
                        }
                        lVar20 = lVar20 + 1;
                        bVar11 = lVar20 < local_a10;
                        iVar17 = 0x17;
                      } while (lVar20 < local_a10);
                    }
                    if (!bVar11) {
                      local_9a0 = &local_9b8->tops;
                      std::vector<int,_std::allocator<int>_>::resize(local_9a0,(long)local_a14);
                      bVar11 = 0 < local_a14;
                      iVar17 = 0x1c;
                      if (0 < local_a14) {
                        lVar20 = 0;
                        do {
                          iVar18 = (*dr->_vptr_DataReader[3])(dr,&local_988,4);
                          if (CONCAT44(extraout_var_06,iVar18) != 4) {
                            load_param_bin();
                            iVar17 = 1;
                            break;
                          }
                          (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                          _M_impl.super__Vector_impl_data._M_start[(int)local_988.data].producer =
                               local_a0c;
                          (local_9a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar20] = (int)local_988.data;
                          lVar20 = lVar20 + 1;
                          bVar11 = lVar20 < local_a14;
                        } while (lVar20 < local_a14);
                      }
                      if (!bVar11) {
                        iVar17 = ParamDict::load_param_bin(&local_930,dr);
                        if (iVar17 == 0) {
                          local_a08.elemsize._0_4_ = 0;
                          local_a08.elemsize._4_4_ = 0;
                          local_a08.elempack = 0;
                          local_a08.data = (void *)0x0;
                          local_a08.refcount._0_4_ = 0;
                          local_a08.refcount._4_4_ = 0;
                          local_a08.h = 0;
                          local_a08.c = 0;
                          local_a08.cstep = 0;
                          local_a08.allocator = (Allocator *)0x0;
                          local_a08.dims = 0;
                          local_a08.w = 0;
                          ParamDict::get(&local_988,&local_930,0x1e,&local_a08);
                          piVar22 = (int *)CONCAT44(local_a08.refcount._4_4_,
                                                    local_a08.refcount._0_4_);
                          if (piVar22 != (int *)0x0) {
                            LOCK();
                            *piVar22 = *piVar22 + -1;
                            UNLOCK();
                            if (*piVar22 == 0) {
                              if (local_a08.allocator == (Allocator *)0x0) {
                                if (local_a08.data != (void *)0x0) {
                                  free(local_a08.data);
                                }
                              }
                              else {
                                (**(code **)(*(long *)local_a08.allocator + 0x18))();
                              }
                            }
                          }
                          if (((local_988.data != (void *)0x0) &&
                              ((long)local_988.c * local_988.cstep != 0)) && (0 < local_a14)) {
                            piVar22 = (int *)((long)local_988.data + 8);
                            lVar20 = 0;
                            do {
                              iVar17 = (local_9a0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar20];
                              pBVar5 = (this_00->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              iVar18 = piVar22[-2];
                              if (iVar18 == 3) {
LAB_0012e341:
                                local_a08.w = piVar22[-1];
                                local_a08.h = piVar22[0];
                                local_a08.c = piVar22[1];
                                local_a08.data = (void *)0x0;
                                local_a08.refcount._0_4_ = 0;
                                local_a08.refcount._4_4_ = 0;
                                local_a08.elemsize._0_4_ = 4;
                                local_a08.elemsize._4_4_ = 0;
                                local_a08.elempack = 1;
                                local_a08.allocator = (Allocator *)0x0;
                                local_a08.dims = 3;
                                iVar18 = local_a08.dims;
                                local_a08.dims = 3;
                                local_a08.cstep =
                                     (long)(local_a08.h * local_a08.w) + 3U & 0x3ffffffffffffffc;
                                if (&pBVar5[iVar17].shape != &local_a08) {
                                  piVar6 = pBVar5[iVar17].shape.refcount;
                                  if (piVar6 != (int *)0x0) {
                                    LOCK();
                                    *piVar6 = *piVar6 + -1;
                                    UNLOCK();
                                    if (*piVar6 == 0) {
                                      pvVar7 = pBVar5[iVar17].shape.data;
                                      pAVar8 = pBVar5[iVar17].shape.allocator;
                                      if (pAVar8 == (Allocator *)0x0) {
                                        if (pvVar7 != (void *)0x0) {
                                          free(pvVar7);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar8 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar5[iVar17].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar5[iVar17].shape.elemsize + 4) = 0;
                                  pBVar5[iVar17].shape.data = (void *)0x0;
                                  pBVar5[iVar17].shape.refcount = (int *)0x0;
                                  pBVar5[iVar17].shape.dims = 0;
                                  pBVar5[iVar17].shape.w = 0;
                                  pBVar5[iVar17].shape.h = 0;
                                  pBVar5[iVar17].shape.c = 0;
                                  pBVar5[iVar17].shape.cstep = 0;
                                  pBVar5[iVar17].shape.data = local_a08.data;
                                  pBVar5[iVar17].shape.refcount =
                                       (int *)CONCAT44(local_a08.refcount._4_4_,
                                                       local_a08.refcount._0_4_);
                                  pBVar5[iVar17].shape.elemsize =
                                       CONCAT44(local_a08.elemsize._4_4_,
                                                (undefined4)local_a08.elemsize);
                                  pBVar5[iVar17].shape.elempack = local_a08.elempack;
                                  pBVar5[iVar17].shape.allocator = local_a08.allocator;
                                  pBVar5[iVar17].shape.dims = local_a08.dims;
                                  pBVar5[iVar17].shape.w = local_a08.w;
                                  pBVar5[iVar17].shape.h = local_a08.h;
                                  pBVar5[iVar17].shape.c = local_a08.c;
                                  pBVar5[iVar17].shape.cstep = local_a08.cstep;
                                  iVar18 = local_a08.dims;
                                }
                                local_a08.dims = iVar18;
                                this_00 = local_9b0;
                                piVar6 = (int *)CONCAT44(local_a08.refcount._4_4_,
                                                         local_a08.refcount._0_4_);
                                if (piVar6 != (int *)0x0) {
                                  LOCK();
                                  *piVar6 = *piVar6 + -1;
                                  UNLOCK();
                                  if (*piVar6 == 0) {
                                    if (local_a08.allocator == (Allocator *)0x0) {
                                      if (local_a08.data != (void *)0x0) {
                                        free(local_a08.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_a08.allocator + 0x18))();
                                    }
                                  }
                                }
                              }
                              else if (iVar18 == 2) {
                                local_a08.w = piVar22[-1];
                                local_a08.h = *piVar22;
                                local_a08.data = (void *)0x0;
                                local_a08.refcount._0_4_ = 0;
                                local_a08.refcount._4_4_ = 0;
                                local_a08.elemsize._0_4_ = 4;
                                local_a08.elemsize._4_4_ = 0;
                                local_a08.elempack = 1;
                                local_a08.allocator = (Allocator *)0x0;
                                local_a08.dims = 2;
                                iVar12 = local_a08.dims;
                                local_a08.dims = 2;
                                local_a08.c = 1;
                                local_a08.cstep = (size_t)(local_a08.h * local_a08.w);
                                if (&pBVar5[iVar17].shape != &local_a08) {
                                  piVar6 = pBVar5[iVar17].shape.refcount;
                                  if (piVar6 != (int *)0x0) {
                                    LOCK();
                                    *piVar6 = *piVar6 + -1;
                                    UNLOCK();
                                    if (*piVar6 == 0) {
                                      pvVar7 = pBVar5[iVar17].shape.data;
                                      pAVar8 = pBVar5[iVar17].shape.allocator;
                                      if (pAVar8 == (Allocator *)0x0) {
                                        if (pvVar7 != (void *)0x0) {
                                          free(pvVar7);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar8 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar5[iVar17].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar5[iVar17].shape.elemsize + 4) = 0;
                                  pBVar5[iVar17].shape.data = (void *)0x0;
                                  pBVar5[iVar17].shape.refcount = (int *)0x0;
                                  pBVar5[iVar17].shape.dims = 0;
                                  pBVar5[iVar17].shape.w = 0;
                                  pBVar5[iVar17].shape.h = 0;
                                  pBVar5[iVar17].shape.c = 0;
                                  pBVar5[iVar17].shape.cstep = 0;
                                  pBVar5[iVar17].shape.data = local_a08.data;
                                  pBVar5[iVar17].shape.refcount =
                                       (int *)CONCAT44(local_a08.refcount._4_4_,
                                                       local_a08.refcount._0_4_);
                                  pBVar5[iVar17].shape.elemsize =
                                       CONCAT44(local_a08.elemsize._4_4_,
                                                (undefined4)local_a08.elemsize);
                                  pBVar5[iVar17].shape.elempack = local_a08.elempack;
                                  pBVar5[iVar17].shape.allocator = local_a08.allocator;
                                  pBVar5[iVar17].shape.dims = local_a08.dims;
                                  pBVar5[iVar17].shape.w = local_a08.w;
                                  pBVar5[iVar17].shape.h = local_a08.h;
                                  pBVar5[iVar17].shape.c = local_a08.c;
                                  pBVar5[iVar17].shape.cstep = local_a08.cstep;
                                  iVar12 = local_a08.dims;
                                }
                                local_a08.dims = iVar12;
                                this_00 = local_9b0;
                                piVar6 = (int *)CONCAT44(local_a08.refcount._4_4_,
                                                         local_a08.refcount._0_4_);
                                if (piVar6 != (int *)0x0) {
                                  LOCK();
                                  *piVar6 = *piVar6 + -1;
                                  UNLOCK();
                                  if (*piVar6 == 0) {
                                    if (local_a08.allocator == (Allocator *)0x0) {
                                      if (local_a08.data != (void *)0x0) {
                                        free(local_a08.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_a08.allocator + 0x18))();
                                    }
                                  }
                                }
LAB_0012e337:
                                if (iVar18 == 3) goto LAB_0012e341;
                              }
                              else if (iVar18 == 1) {
                                local_a08.w = piVar22[-1];
                                local_a08.cstep = (size_t)local_a08.w;
                                local_a08.data = (void *)0x0;
                                local_a08.refcount._0_4_ = 0;
                                local_a08.refcount._4_4_ = 0;
                                local_a08.elemsize._0_4_ = 4;
                                local_a08.elemsize._4_4_ = 0;
                                local_a08.elempack = 1;
                                local_a08.allocator = (Allocator *)0x0;
                                local_a08.dims = 1;
                                iVar12 = local_a08.dims;
                                local_a08.dims = 1;
                                local_a08.h = 1;
                                local_a08.c = 1;
                                if (&pBVar5[iVar17].shape != &local_a08) {
                                  piVar6 = pBVar5[iVar17].shape.refcount;
                                  if (piVar6 != (int *)0x0) {
                                    LOCK();
                                    *piVar6 = *piVar6 + -1;
                                    UNLOCK();
                                    if (*piVar6 == 0) {
                                      pvVar7 = pBVar5[iVar17].shape.data;
                                      pAVar8 = pBVar5[iVar17].shape.allocator;
                                      if (pAVar8 == (Allocator *)0x0) {
                                        if (pvVar7 != (void *)0x0) {
                                          free(pvVar7);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar8 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar5[iVar17].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar5[iVar17].shape.elemsize + 4) = 0;
                                  pBVar5[iVar17].shape.data = (void *)0x0;
                                  pBVar5[iVar17].shape.refcount = (int *)0x0;
                                  pBVar5[iVar17].shape.dims = 0;
                                  pBVar5[iVar17].shape.w = 0;
                                  pBVar5[iVar17].shape.h = 0;
                                  pBVar5[iVar17].shape.c = 0;
                                  pBVar5[iVar17].shape.cstep = 0;
                                  pBVar5[iVar17].shape.data = local_a08.data;
                                  pBVar5[iVar17].shape.refcount =
                                       (int *)CONCAT44(local_a08.refcount._4_4_,
                                                       local_a08.refcount._0_4_);
                                  pBVar5[iVar17].shape.elemsize =
                                       CONCAT44(local_a08.elemsize._4_4_,
                                                (undefined4)local_a08.elemsize);
                                  pBVar5[iVar17].shape.elempack = local_a08.elempack;
                                  pBVar5[iVar17].shape.allocator = local_a08.allocator;
                                  pBVar5[iVar17].shape.dims = local_a08.dims;
                                  pBVar5[iVar17].shape.w = local_a08.w;
                                  pBVar5[iVar17].shape.h = local_a08.h;
                                  pBVar5[iVar17].shape.c = local_a08.c;
                                  pBVar5[iVar17].shape.cstep = local_a08.cstep;
                                  iVar12 = local_a08.dims;
                                }
                                local_a08.dims = iVar12;
                                this_00 = local_9b0;
                                piVar6 = (int *)CONCAT44(local_a08.refcount._4_4_,
                                                         local_a08.refcount._0_4_);
                                if (piVar6 != (int *)0x0) {
                                  LOCK();
                                  *piVar6 = *piVar6 + -1;
                                  UNLOCK();
                                  if (*piVar6 == 0) {
                                    if (local_a08.allocator == (Allocator *)0x0) {
                                      if (local_a08.data != (void *)0x0) {
                                        free(local_a08.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_a08.allocator + 0x18))();
                                    }
                                  }
                                }
                                goto LAB_0012e337;
                              }
                              lVar20 = lVar20 + 1;
                              piVar22 = piVar22 + 4;
                            } while (lVar20 < local_a14);
                          }
                          local_a08.elempack = 0;
                          local_a08.elemsize._4_4_ = 0;
                          local_a08.elemsize._0_4_ = 0;
                          local_a08.refcount._4_4_ = 0;
                          local_a08.refcount._0_4_ = 0;
                          local_a08.cstep = 0;
                          local_a08.h = 0;
                          local_a08.c = 0;
                          local_a08.dims = 0;
                          local_a08.w = 0;
                          local_a08.data = (void *)0x0;
                          pvVar1 = &local_9b8->bottom_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_a10);
                          if (0 < local_a10) {
                            lVar21 = 0;
                            lVar20 = 0;
                            do {
                              iVar17 = (local_990->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar20];
                              pBVar5 = (this_00->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              pMVar9 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar9->data + lVar21);
                              if ((Mat *)puVar2 != &pBVar5[iVar17].shape) {
                                piVar22 = pBVar5[iVar17].shape.refcount;
                                if (piVar22 != (int *)0x0) {
                                  LOCK();
                                  *piVar22 = *piVar22 + 1;
                                  UNLOCK();
                                }
                                piVar22 = *(int **)((long)&pMVar9->refcount + lVar21);
                                if (piVar22 != (int *)0x0) {
                                  LOCK();
                                  *piVar22 = *piVar22 + -1;
                                  UNLOCK();
                                  if (*piVar22 == 0) {
                                    pvVar7 = *(void **)((long)&pMVar9->data + lVar21);
                                    plVar10 = *(long **)((long)&pMVar9->allocator + lVar21);
                                    if (plVar10 == (long *)0x0) {
                                      if (pvVar7 != (void *)0x0) {
                                        free(pvVar7);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar10 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar9->dims + lVar21);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined8 *)((long)&pMVar9->cstep + lVar21) = 0;
                                piVar22 = pBVar5[iVar17].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar9->data + lVar21);
                                *puVar2 = pBVar5[iVar17].shape.data;
                                puVar2[1] = piVar22;
                                *(size_t *)((long)&pMVar9->elemsize + lVar21) =
                                     pBVar5[iVar17].shape.elemsize;
                                *(int *)((long)&pMVar9->elempack + lVar21) =
                                     pBVar5[iVar17].shape.elempack;
                                *(Allocator **)((long)&pMVar9->allocator + lVar21) =
                                     pBVar5[iVar17].shape.allocator;
                                iVar18 = pBVar5[iVar17].shape.w;
                                iVar12 = pBVar5[iVar17].shape.h;
                                iVar13 = pBVar5[iVar17].shape.c;
                                piVar22 = (int *)((long)&pMVar9->dims + lVar21);
                                *piVar22 = pBVar5[iVar17].shape.dims;
                                piVar22[1] = iVar18;
                                piVar22[2] = iVar12;
                                piVar22[3] = iVar13;
                                *(size_t *)((long)&pMVar9->cstep + lVar21) =
                                     pBVar5[iVar17].shape.cstep;
                              }
                              lVar20 = lVar20 + 1;
                              lVar21 = lVar21 + 0x40;
                              this_00 = local_9b0;
                            } while (lVar20 < local_a10);
                          }
                          pvVar1 = &local_9b8->top_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_a14);
                          if (0 < local_a14) {
                            lVar21 = 0;
                            lVar20 = 0;
                            do {
                              iVar17 = (local_9a0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar20];
                              pBVar5 = (this_00->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              pMVar9 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar9->data + lVar21);
                              if ((Mat *)puVar2 != &pBVar5[iVar17].shape) {
                                piVar22 = pBVar5[iVar17].shape.refcount;
                                if (piVar22 != (int *)0x0) {
                                  LOCK();
                                  *piVar22 = *piVar22 + 1;
                                  UNLOCK();
                                }
                                piVar22 = *(int **)((long)&pMVar9->refcount + lVar21);
                                if (piVar22 != (int *)0x0) {
                                  LOCK();
                                  *piVar22 = *piVar22 + -1;
                                  UNLOCK();
                                  if (*piVar22 == 0) {
                                    pvVar7 = *(void **)((long)&pMVar9->data + lVar21);
                                    plVar10 = *(long **)((long)&pMVar9->allocator + lVar21);
                                    if (plVar10 == (long *)0x0) {
                                      if (pvVar7 != (void *)0x0) {
                                        free(pvVar7);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar10 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar9->dims + lVar21);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined8 *)((long)&pMVar9->cstep + lVar21) = 0;
                                piVar22 = pBVar5[iVar17].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar9->data + lVar21);
                                *puVar2 = pBVar5[iVar17].shape.data;
                                puVar2[1] = piVar22;
                                *(size_t *)((long)&pMVar9->elemsize + lVar21) =
                                     pBVar5[iVar17].shape.elemsize;
                                *(int *)((long)&pMVar9->elempack + lVar21) =
                                     pBVar5[iVar17].shape.elempack;
                                *(Allocator **)((long)&pMVar9->allocator + lVar21) =
                                     pBVar5[iVar17].shape.allocator;
                                iVar18 = pBVar5[iVar17].shape.w;
                                iVar12 = pBVar5[iVar17].shape.h;
                                iVar13 = pBVar5[iVar17].shape.c;
                                piVar22 = (int *)((long)&pMVar9->dims + lVar21);
                                *piVar22 = pBVar5[iVar17].shape.dims;
                                piVar22[1] = iVar18;
                                piVar22[2] = iVar12;
                                piVar22[3] = iVar13;
                                *(size_t *)((long)&pMVar9->cstep + lVar21) =
                                     pBVar5[iVar17].shape.cstep;
                              }
                              lVar20 = lVar20 + 1;
                              lVar21 = lVar21 + 0x40;
                              this_00 = local_9b0;
                            } while (lVar20 < local_a14);
                          }
                          pLVar19 = local_9b8;
                          iVar17 = (*local_9b8->_vptr_Layer[2])(local_9b8,&local_930);
                          dr = local_940;
                          if (iVar17 == 0) {
                            (local_938->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[local_a0c] = pLVar19;
                            iVar17 = 0;
                          }
                          else {
                            load_param_bin();
                            iVar17 = 0xe;
                          }
                          piVar22 = (int *)CONCAT44(local_988.refcount._4_4_,
                                                    local_988.refcount._0_4_);
                          if (piVar22 != (int *)0x0) {
                            LOCK();
                            *piVar22 = *piVar22 + -1;
                            UNLOCK();
                            if (*piVar22 == 0) {
                              if (local_988.allocator == (Allocator *)0x0) {
                                if (local_988.data != (void *)0x0) {
                                  free(local_988.data);
                                }
                              }
                              else {
                                (**(code **)(*(long *)local_988.allocator + 0x18))();
                              }
                            }
                          }
                          local_988.elemsize._0_4_ = 0;
                          local_988._20_8_ = 0;
                          local_988.data = (void *)0x0;
                          local_988.refcount._0_4_ = 0;
                          local_988.refcount._4_4_ = 0;
                          local_988.dims = 0;
                          local_988.w = 0;
                          local_988.h = 0;
                          local_988.c = 0;
                          local_988.cstep = 0;
                        }
                        else {
                          load_param_bin();
                          iVar17 = 0xe;
                        }
                      }
                    }
                  }
                }
                else {
                  load_param_bin();
LAB_0012dffe:
                  iVar17 = 1;
                }
                if ((iVar17 != 0xe) && (iVar17 != 0)) break;
                local_a0c = local_a0c + 1;
                local_a15 = local_a0c < local_9bc;
                pvVar15 = local_9b0;
                pDVar16 = local_940;
              } while (local_a0c < local_9bc);
            }
            lVar20 = 0x8c0;
            do {
              piVar22 = *(int **)((long)&local_930.params[0].v.data + lVar20);
              if (piVar22 != (int *)0x0) {
                LOCK();
                *piVar22 = *piVar22 + -1;
                UNLOCK();
                if (*piVar22 == 0) {
                  pvVar7 = *(void **)((long)&local_930.params[0].type + lVar20);
                  plVar10 = *(long **)((long)&local_930.params[0].v.elempack + lVar20);
                  if (plVar10 == (long *)0x0) {
                    if (pvVar7 != (void *)0x0) {
                      free(pvVar7);
                    }
                  }
                  else {
                    (**(code **)(*plVar10 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar20 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar20 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar20) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar20) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar20) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar20) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar20) = 0;
              lVar20 = lVar20 + -0x48;
            } while (lVar20 != -0x40);
            return -(uint)local_a15;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        NCNN_LOGE("read " #buf " failed"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;

#if __APPLE__
        opt.use_image_storage = false;
#endif
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param failed");
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param failed");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}